

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O2

wchar_t tar_read_header(archive_read *a,tar *tar,archive_entry *entry,size_t *unconsumed)

{
  archive_string *as;
  char cVar1;
  wchar_t wVar2;
  int iVar3;
  wchar_t wVar4;
  archive_read *a_00;
  char *pcVar5;
  int64_t iVar6;
  dev_t dVar7;
  gnu_sparse *sparse;
  archive_string_conv *paVar8;
  archive_acl *acl;
  int *piVar9;
  wchar_t *pwVar10;
  wchar_t *pwVar11;
  char *pcVar12;
  size_t min;
  int64_t remaining_00;
  ulong uVar13;
  long lVar14;
  wchar_t *pwVar15;
  uint uVar16;
  char *pcVar17;
  void *pvVar18;
  size_t *in_R8;
  long lVar19;
  ulong uStack_60;
  int64_t remaining;
  wchar_t local_3c;
  ssize_t bytes;
  
  uStack_60 = 1;
  do {
    tar_flush_unconsumed(a,unconsumed);
    pvVar18 = (void *)0x200;
    a_00 = (archive_read *)__archive_read_ahead(a,0x200,&bytes);
    if (bytes < 0) {
      uStack_60 = bytes & 0xffffffff;
      goto LAB_004afc08;
    }
    if (bytes == 0) goto LAB_004afc08;
    if ((ulong)bytes < 0x200) {
      pcVar5 = "Truncated tar archive";
      goto LAB_004afbd2;
    }
    *unconsumed = 0x200;
    if (((char)(a_00->archive).magic != '\0') ||
       (wVar2 = archive_block_is_null((char *)a_00), wVar2 == L'\0')) {
      wVar2 = checksum(a_00,pvVar18);
      if (wVar2 == L'\0') {
        tar_flush_unconsumed(a,unconsumed);
        archive_set_error(&a->archive,0x16,"Damaged tar archive");
        uStack_60 = 0xfffffffffffffff6;
        goto LAB_004afc08;
      }
      iVar3 = tar->header_recursion_depth;
      tar->header_recursion_depth = iVar3 + 1;
      if (0x1f < iVar3) {
        tar_flush_unconsumed(a,unconsumed);
        pcVar5 = "Too many special headers";
        iVar3 = 0x16;
        goto LAB_004afbb8;
      }
      cVar1 = *(char *)((long)&(a_00->archive).read_data_requested + 4);
      pcVar5 = "POSIX pax interchange format";
      if (cVar1 == 'x') {
        (a->archive).archive_format = 0x30002;
      }
      else {
        if (cVar1 == 'K') {
          wVar2 = read_body_to_string(a,(tar *)&tar->longlink,(archive_string *)a_00,unconsumed,
                                      in_R8);
          if ((wVar2 != L'\0') ||
             ((wVar2 = tar_read_header(a,tar,entry,unconsumed), wVar2 != L'\0' &&
              (wVar2 != L'\xffffffec')))) goto LAB_004aff15;
          archive_entry_copy_link(entry,(tar->longlink).s);
          goto LAB_004b00b9;
        }
        if (cVar1 == 'L') {
          wVar2 = read_body_to_string(a,(tar *)&tar->longname,(archive_string *)a_00,unconsumed,
                                      in_R8);
          if ((wVar2 != L'\0') ||
             ((wVar2 = tar_read_header(a,tar,entry,unconsumed), wVar2 != L'\0' &&
              (wVar2 != L'\xffffffec')))) goto LAB_004aff15;
          wVar4 = _archive_entry_copy_pathname_l
                            (entry,(tar->longname).s,(tar->longname).length,tar->sconv);
          if (wVar4 == L'\0') goto LAB_004aff1f;
          wVar2 = set_conversion_failed_error(a,tar->sconv,"Pathname");
          goto LAB_004aff15;
        }
        if (cVar1 == 'V') {
          wVar2 = tar_read_header(a,tar,entry,unconsumed);
          goto LAB_004aff15;
        }
        if (cVar1 != 'X') {
          if (cVar1 == 'g') {
            (a->archive).archive_format = 0x30002;
            (a->archive).archive_format_name = "POSIX pax interchange format";
            wVar2 = read_body_to_string(a,(tar *)&tar->pax_global,(archive_string *)a_00,unconsumed,
                                        in_R8);
            if ((wVar2 != L'\0') ||
               (wVar2 = tar_read_header(a,tar,entry,unconsumed), wVar2 != L'\x01'))
            goto LAB_004aff15;
            goto LAB_004afc08;
          }
          if (cVar1 == 'A') {
            (a->archive).archive_format = 0x30002;
            (a->archive).archive_format_name = "Solaris tar";
            iVar6 = tar_atol((char *)((long)&(a_00->archive).read_data_offset + 4),0xc);
            wVar2 = read_body_to_string(a,tar,(archive_string *)a_00,unconsumed,in_R8);
            if ((wVar2 != L'\0') ||
               ((wVar2 = tar_read_header(a,tar,entry,unconsumed), wVar2 != L'\0' &&
                (wVar2 != L'\xffffffec')))) goto LAB_004aff15;
            wVar2 = L'\xffffffec';
            pcVar5 = (tar->acl_text).s;
            pcVar17 = pcVar5 + iVar6;
            lVar19 = 0;
            goto LAB_004afcd2;
          }
          if (*(long *)((long)&(a_00->client).dataset + 1) != 0x20207261747375) {
            iVar3 = bcmp((void *)((long)&(a_00->client).dataset + 1),"ustar",5);
            if (iVar3 != 0) {
              (a->archive).archive_format = 0x30000;
              (a->archive).archive_format_name = "tar (non-POSIX)";
              wVar2 = _archive_entry_copy_pathname_l(entry,(char *)a_00,100,tar->sconv);
              wVar4 = L'\0';
              if ((wVar2 != L'\0') &&
                 (wVar4 = set_conversion_failed_error(a,tar->sconv,"Pathname"),
                 wVar4 == L'\xffffffe2')) goto LAB_004afbdf;
              wVar2 = header_common(a,tar,entry,a_00);
              if (wVar4 < wVar2) {
                wVar2 = wVar4;
              }
              tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
              goto LAB_004aff15;
            }
            if ((a->archive).archive_format != 0x30002) {
              (a->archive).archive_format = 0x30001;
              (a->archive).archive_format_name = "POSIX ustar format";
            }
            as = &tar->entry_pathname;
            cVar1 = *(char *)((long)&a_00->bidders[1].options + 1);
            (tar->entry_pathname).length = 0;
            if ((cVar1 != '\0') &&
               (archive_strncat(as,(void *)((long)&a_00->bidders[1].options + 1),0x9b),
               (tar->entry_pathname).s[(tar->entry_pathname).length - 1] != '/')) {
              archive_strappend_char(as,'/');
            }
            archive_strncat(as,a_00,100);
            wVar2 = _archive_entry_copy_pathname_l
                              (entry,(tar->entry_pathname).s,(tar->entry_pathname).length,tar->sconv
                              );
            if (wVar2 == L'\0') {
              wVar2 = L'\0';
            }
            else {
              wVar2 = set_conversion_failed_error(a,tar->sconv,"Pathname");
              if (wVar2 == L'\xffffffe2') goto LAB_004afbdf;
            }
            wVar4 = header_common(a,tar,entry,a_00);
            if (wVar4 == L'\xffffffe2') goto LAB_004afbdf;
            if (wVar4 < wVar2) {
              wVar2 = wVar4;
            }
            wVar4 = _archive_entry_copy_uname_l
                              (entry,(char *)((long)&a_00->bidders[0].data + 1),0x20,tar->sconv);
            if (((wVar4 != L'\0') &&
                (wVar2 = set_conversion_failed_error(a,tar->sconv,"Uname"), wVar2 == L'\xffffffe2'))
               || ((wVar4 = _archive_entry_copy_gname_l
                                      (entry,(char *)((long)&a_00->bidders[0].options + 1),0x20,
                                       tar->sconv), wVar4 != L'\0' &&
                   (wVar2 = set_conversion_failed_error(a,tar->sconv,"Gname"),
                   wVar2 == L'\xffffffe2')))) goto LAB_004afbdf;
            if ((byte)(*(char *)((long)&(a_00->archive).read_data_requested + 4) - 0x33U) < 2) {
              dVar7 = tar_atol((char *)((long)&a_00->bidders[1].bid + 1),8);
              archive_entry_set_rdevmajor(entry,dVar7);
              dVar7 = tar_atol((char *)((long)&a_00->bidders[1].init + 1),8);
              archive_entry_set_rdevminor(entry,dVar7);
            }
            tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
            goto LAB_004aff1f;
          }
          (a->archive).archive_format = 0x30004;
          (a->archive).archive_format_name = "GNU tar format";
          wVar2 = header_common(a,tar,entry,a_00);
          if ((((wVar2 == L'\xffffffe2') ||
               ((wVar4 = _archive_entry_copy_pathname_l(entry,(char *)a_00,100,tar->sconv),
                wVar4 != L'\0' &&
                (wVar2 = set_conversion_failed_error(a,tar->sconv,"Pathname"),
                wVar2 == L'\xffffffe2')))) ||
              ((wVar4 = _archive_entry_copy_uname_l
                                  (entry,(char *)((long)&a_00->bidders[0].data + 1),0x20,tar->sconv)
               , wVar4 != L'\0' &&
               (wVar2 = set_conversion_failed_error(a,tar->sconv,"Uname"), wVar2 == L'\xffffffe2')))
              ) || ((wVar4 = _archive_entry_copy_gname_l
                                       (entry,(char *)((long)&a_00->bidders[0].options + 1),0x20,
                                        tar->sconv), wVar4 != L'\0' &&
                    (wVar2 = set_conversion_failed_error(a,tar->sconv,"Gname"),
                    wVar2 == L'\xffffffe2')))) goto LAB_004afbdf;
          if ((byte)(*(char *)((long)&(a_00->archive).read_data_requested + 4) - 0x33U) < 2) {
            dVar7 = tar_atol((char *)((long)&a_00->bidders[1].bid + 1),8);
            archive_entry_set_rdevmajor(entry,dVar7);
            dVar7 = tar_atol((char *)((long)&a_00->bidders[1].init + 1),8);
            archive_entry_set_rdevminor(entry,dVar7);
          }
          else {
            archive_entry_set_rdev(entry,0);
          }
          tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
          iVar6 = tar_atol((char *)((long)&a_00->bidders[1].options + 1),0xc);
          if (0 < iVar6) {
            archive_entry_set_atime(entry,iVar6,0);
          }
          iVar6 = tar_atol((char *)((long)&a_00->bidders[1].free + 5),0xc);
          if (0 < iVar6) {
            archive_entry_set_ctime(entry,iVar6,0);
          }
          if (*(char *)((long)&a_00->bidders[4].init + 3) != '\0') {
            iVar6 = tar_atol((char *)((long)&a_00->bidders[4].init + 3),0xc);
            tar->realsize = iVar6;
            archive_entry_set_size(entry,iVar6);
            tar->realsize_override = 1;
          }
          if (*(char *)((long)&a_00->bidders[2].init + 2) == '\0') goto LAB_004aff1f;
          wVar4 = gnu_sparse_old_parse
                            (a,tar,(gnu_sparse *)((long)&a_00->bidders[2].init + 2),L'\x04');
          if (wVar4 != L'\0') goto LAB_004afbdf;
          if (*(char *)((long)&a_00->bidders[4].init + 2) == '\0') goto LAB_004aff15;
          goto LAB_004b0381;
        }
        (a->archive).archive_format = 0x30002;
        pcVar5 = "POSIX pax interchange format (Sun variant)";
      }
      (a->archive).archive_format_name = pcVar5;
      wVar2 = header_pax_extensions(a,tar,entry,a_00,unconsumed);
      goto LAB_004aff15;
    }
    if ((a->archive).archive_format_name == (char *)0x0) {
      (a->archive).archive_format = 0x30000;
      (a->archive).archive_format_name = "tar";
    }
  } while (tar->read_concatenated_archives != 0);
  tar_flush_unconsumed(a,unconsumed);
  pcVar5 = (char *)__archive_read_ahead(a,0x200,(ssize_t *)0x0);
  if (((pcVar5 != (char *)0x0) && (*pcVar5 == '\0')) &&
     (wVar2 = archive_block_is_null(pcVar5), wVar2 != L'\0')) {
    __archive_read_consume(a,0x200);
  }
  archive_clear_error(&a->archive);
  goto LAB_004afc08;
LAB_004b0381:
  tar_flush_unconsumed(a,unconsumed);
  sparse = (gnu_sparse *)__archive_read_ahead(a,0x200,&remaining);
  if (-1 < remaining) {
    if ((ulong)remaining < 0x200) {
      pcVar5 = "Truncated tar archive detected while reading sparse file data";
LAB_004afbd2:
      iVar3 = 0x54;
      goto LAB_004afbd4;
    }
    *unconsumed = 0x200;
    wVar4 = gnu_sparse_old_parse(a,tar,sparse,L'\x15');
    if (wVar4 == L'\0') goto code_r0x004b03d9;
  }
  goto LAB_004afbdf;
code_r0x004b03d9:
  if (sparse[0x15].offset[0] == '\0') goto code_r0x004b03e3;
  goto LAB_004b0381;
LAB_004afcd2:
  cVar1 = *pcVar5;
  if ((cVar1 == '\0') || (pcVar17 <= pcVar5)) goto LAB_004b026b;
  if ((byte)(cVar1 - 0x38U) < 0xf8) {
    pcVar5 = "Malformed Solaris ACL attribute (invalid digit)";
    goto LAB_004b04da;
  }
  lVar19 = (ulong)(byte)(cVar1 - 0x30) + lVar19 * 8;
  if (0xffffff < lVar19) {
    pcVar5 = "Malformed Solaris ACL attribute (count too large)";
    goto LAB_004b04da;
  }
  pcVar5 = pcVar5 + 1;
  goto LAB_004afcd2;
LAB_004b026b:
  uVar16 = (uint)lVar19 & 0xfffc0000;
  if (uVar16 == 0x40000) {
    wVar4 = L'Ā';
LAB_004b0413:
    if (pcVar5 + 1 < pcVar17) {
      lVar19 = 1;
      do {
        lVar14 = lVar19;
        if (pcVar5[lVar14] == '\0') break;
        lVar19 = lVar14 + 1;
      } while (pcVar5 + lVar14 < pcVar17);
      local_3c = wVar4;
      if (tar->sconv_acl == (archive_string_conv *)0x0) {
        paVar8 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
        tar->sconv_acl = paVar8;
        if (paVar8 != (archive_string_conv *)0x0) goto LAB_004b0468;
        goto LAB_004afbdf;
      }
LAB_004b0468:
      (tar->localname).length = 0;
      archive_strncat(&tar->localname,pcVar5 + 1,lVar14 - 1);
      acl = archive_entry_acl(entry);
      wVar2 = archive_acl_from_text_l(acl,(tar->localname).s,local_3c,tar->sconv_acl);
      if (wVar2 != L'\0') {
        piVar9 = __errno_location();
        if (*piVar9 == 0xc) {
          pcVar5 = "Can\'t allocate memory for ACL";
          iVar3 = 0xc;
        }
        else {
          pcVar5 = "Malformed Solaris ACL attribute (unparsable)";
          iVar3 = -1;
        }
        archive_set_error(&a->archive,iVar3,pcVar5);
        goto LAB_004aff15;
      }
LAB_004b00b9:
      wVar2 = L'\0';
    }
    else {
      pcVar5 = "Malformed Solaris ACL attribute (body overflow)";
LAB_004b04da:
      archive_set_error(&a->archive,-1,pcVar5);
    }
  }
  else {
    if (uVar16 == 0xc0000) {
      wVar4 = L'㰀';
      goto LAB_004b0413;
    }
    archive_set_error(&a->archive,-1,"Malformed Solaris ACL attribute (unsupported type %o)");
  }
  tar_flush_unconsumed(a,unconsumed);
  iVar3 = tar->header_recursion_depth + -1;
  tar->header_recursion_depth = iVar3;
LAB_004b0506:
  if ((iVar3 == 0) && (tar->process_mac_extensions != 0)) {
    pwVar10 = archive_entry_pathname_w(entry);
    pwVar15 = pwVar10;
    if (pwVar10 == (wchar_t *)0x0) {
      pcVar5 = archive_entry_pathname(entry);
      pcVar17 = pcVar5;
      if (pcVar5 == (char *)0x0) {
        wVar4 = L'\xffffffe7';
      }
      else {
        do {
          while( true ) {
            pcVar12 = pcVar5 + 1;
            cVar1 = *pcVar5;
            pcVar5 = pcVar12;
            if (cVar1 != '/') break;
            if (*pcVar12 != '\0') {
              pcVar17 = pcVar12;
            }
          }
        } while (cVar1 != '\0');
        wVar4 = L'\0';
        if (((*pcVar17 == '.') && (pcVar17[1] == '_')) && (pcVar17[2] != '\0')) goto LAB_004b05a9;
      }
    }
    else {
      do {
        while( true ) {
          pwVar11 = pwVar10 + 1;
          wVar4 = *pwVar10;
          pwVar10 = pwVar11;
          if (wVar4 != L'/') break;
          if (*pwVar11 != L'\0') {
            pwVar15 = pwVar11;
          }
        }
      } while (wVar4 != L'\0');
      wVar4 = L'\0';
      if (((*pwVar15 == L'.') && (pwVar15[1] == L'_')) && (pwVar15[2] != L'\0')) {
LAB_004b05a9:
        min = archive_entry_size(entry);
        pvVar18 = __archive_read_ahead(a,min,(ssize_t *)0x0);
        if (pvVar18 == (void *)0x0) {
          *unconsumed = 0;
          wVar4 = L'\xffffffe2';
        }
        else {
          archive_entry_copy_mac_metadata(entry,pvVar18,min);
          *unconsumed = min + 0x1ff & 0xfffffffffffffe00;
          tar_flush_unconsumed(a,unconsumed);
          wVar4 = tar_read_header(a,tar,entry,unconsumed);
        }
      }
    }
    if (wVar4 < wVar2) {
      wVar2 = wVar4;
    }
  }
LAB_004b0615:
  if (wVar2 != L'\xffffffec') {
    if (wVar2 == L'\x01') {
      pcVar5 = "Damaged tar archive";
      iVar3 = 0x16;
LAB_004afbd4:
      archive_set_error(&a->archive,iVar3,pcVar5);
      goto LAB_004afbdf;
    }
    uStack_60 = 0xffffffe2;
    if (wVar2 != L'\0') goto LAB_004afc08;
  }
  if (tar->sparse_gnu_pending == '\0') {
    uStack_60 = (ulong)(uint)wVar2;
  }
  else if ((tar->sparse_gnu_major == 1) && (tar->sparse_gnu_minor == 0)) {
    tar->sparse_gnu_pending = '\0';
    gnu_clear_sparse_list(tar);
    remaining = tar->entry_bytes_remaining;
    iVar6 = gnu_sparse_10_atol(a,tar,&remaining,unconsumed);
    if (-1 < (int)iVar6) {
      iVar3 = (int)iVar6 + 1;
      while (iVar3 = iVar3 + -1, 0 < iVar3) {
        iVar6 = gnu_sparse_10_atol(a,tar,&remaining,unconsumed);
        if (((iVar6 < 0) ||
            (remaining_00 = gnu_sparse_10_atol(a,tar,&remaining,unconsumed), remaining_00 < 0)) ||
           (wVar4 = gnu_add_sparse_entry(a,tar,iVar6,remaining_00), wVar4 != L'\0'))
        goto LAB_004b076d;
      }
      tar_flush_unconsumed(a,unconsumed);
      lVar19 = tar->entry_bytes_remaining - remaining;
      uStack_60 = (ulong)(-(int)lVar19 & 0x1ff);
      if (((long)uStack_60 <= remaining) &&
         (uVar13 = __archive_read_consume(a,uStack_60), uStack_60 == uVar13)) {
        uStack_60 = uStack_60 + lVar19;
        if ((long)uStack_60 < 0) goto LAB_004afc08;
        tar->entry_bytes_remaining = tar->entry_bytes_remaining - uStack_60;
        tar->sparse_gnu_pending = '\0';
        goto LAB_004afbe2;
      }
    }
LAB_004b076d:
    uStack_60 = 0xffffffffffffffe2;
  }
  else {
    pcVar5 = "Unrecognized GNU sparse file format";
    iVar3 = -1;
LAB_004afbb8:
    archive_set_error(&a->archive,iVar3,pcVar5);
    uStack_60 = 0xffffffffffffffec;
  }
  goto LAB_004afc08;
code_r0x004b03e3:
  if (tar->sparse_list != (sparse_block *)0x0) {
    tar->entry_offset = tar->sparse_list->offset;
  }
LAB_004aff15:
  if (wVar2 != L'\xffffffe2') {
LAB_004aff1f:
    tar_flush_unconsumed(a,unconsumed);
    iVar3 = tar->header_recursion_depth + -1;
    tar->header_recursion_depth = iVar3;
    if ((wVar2 == L'\0') || (wVar2 == L'\xffffffec')) goto LAB_004b0506;
    goto LAB_004b0615;
  }
LAB_004afbdf:
  wVar2 = L'\xffffffe2';
LAB_004afbe2:
  uStack_60 = (ulong)(uint)wVar2;
LAB_004afc08:
  return (wchar_t)uStack_60;
}

Assistant:

static int
tar_read_header(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, size_t *unconsumed)
{
	ssize_t bytes;
	int err;
	const char *h;
	const struct archive_entry_header_ustar *header;
	const struct archive_entry_header_gnutar *gnuheader;

	/* Loop until we find a workable header record. */
	for (;;) {
		tar_flush_unconsumed(a, unconsumed);

		/* Read 512-byte header record */
		h = __archive_read_ahead(a, 512, &bytes);
		if (bytes < 0)
			return ((int)bytes);
		if (bytes == 0) { /* EOF at a block boundary. */
			/* Some writers do omit the block of nulls. <sigh> */
			return (ARCHIVE_EOF);
		}
		if (bytes < 512) {  /* Short block at EOF; this is bad. */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated tar archive");
			return (ARCHIVE_FATAL);
		}
		*unconsumed = 512;

		/* Header is workable if it's not an end-of-archive mark. */
		if (h[0] != 0 || !archive_block_is_null(h))
			break;

		/* Ensure format is set for archives with only null blocks. */
		if (a->archive.archive_format_name == NULL) {
			a->archive.archive_format = ARCHIVE_FORMAT_TAR;
			a->archive.archive_format_name = "tar";
		}

		if (!tar->read_concatenated_archives) {
			/* Try to consume a second all-null record, as well. */
			tar_flush_unconsumed(a, unconsumed);
			h = __archive_read_ahead(a, 512, NULL);
			if (h != NULL && h[0] == 0 && archive_block_is_null(h))
				__archive_read_consume(a, 512);
			archive_clear_error(&a->archive);
			return (ARCHIVE_EOF);
		}

		/*
		 * We're reading concatenated archives, ignore this block and
		 * loop to get the next.
		 */
	}

	/*
	 * Note: If the checksum fails and we return ARCHIVE_RETRY,
	 * then the client is likely to just retry.  This is a very
	 * crude way to search for the next valid header!
	 *
	 * TODO: Improve this by implementing a real header scan.
	 */
	if (!checksum(a, h)) {
		tar_flush_unconsumed(a, unconsumed);
		archive_set_error(&a->archive, EINVAL, "Damaged tar archive");
		return (ARCHIVE_RETRY); /* Retryable: Invalid header */
	}

	if (++tar->header_recursion_depth > 32) {
		tar_flush_unconsumed(a, unconsumed);
		archive_set_error(&a->archive, EINVAL, "Too many special headers");
		return (ARCHIVE_WARN);
	}

	/* Determine the format variant. */
	header = (const struct archive_entry_header_ustar *)h;

	switch(header->typeflag[0]) {
	case 'A': /* Solaris tar ACL */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name = "Solaris tar";
		err = header_Solaris_ACL(a, tar, entry, h, unconsumed);
		break;
	case 'g': /* POSIX-standard 'g' header. */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name = "POSIX pax interchange format";
		err = header_pax_global(a, tar, entry, h, unconsumed);
		if (err == ARCHIVE_EOF)
			return (err);
		break;
	case 'K': /* Long link name (GNU tar, others) */
		err = header_longlink(a, tar, entry, h, unconsumed);
		break;
	case 'L': /* Long filename (GNU tar, others) */
		err = header_longname(a, tar, entry, h, unconsumed);
		break;
	case 'V': /* GNU volume header */
		err = header_volume(a, tar, entry, h, unconsumed);
		break;
	case 'X': /* Used by SUN tar; same as 'x'. */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name =
		    "POSIX pax interchange format (Sun variant)";
		err = header_pax_extensions(a, tar, entry, h, unconsumed);
		break;
	case 'x': /* POSIX-standard 'x' header. */
		a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
		a->archive.archive_format_name = "POSIX pax interchange format";
		err = header_pax_extensions(a, tar, entry, h, unconsumed);
		break;
	default:
		gnuheader = (const struct archive_entry_header_gnutar *)h;
		if (memcmp(gnuheader->magic, "ustar  \0", 8) == 0) {
			a->archive.archive_format = ARCHIVE_FORMAT_TAR_GNUTAR;
			a->archive.archive_format_name = "GNU tar format";
			err = header_gnutar(a, tar, entry, h, unconsumed);
		} else if (memcmp(header->magic, "ustar", 5) == 0) {
			if (a->archive.archive_format != ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE) {
				a->archive.archive_format = ARCHIVE_FORMAT_TAR_USTAR;
				a->archive.archive_format_name = "POSIX ustar format";
			}
			err = header_ustar(a, tar, entry, h);
		} else {
			a->archive.archive_format = ARCHIVE_FORMAT_TAR;
			a->archive.archive_format_name = "tar (non-POSIX)";
			err = header_old_tar(a, tar, entry, h);
		}
	}
	if (err == ARCHIVE_FATAL)
		return (err);

	tar_flush_unconsumed(a, unconsumed);

	h = NULL;
	header = NULL;

	--tar->header_recursion_depth;
	/* Yuck.  Apple's design here ends up storing long pathname
	 * extensions for both the AppleDouble extension entry and the
	 * regular entry.
	 */
	if ((err == ARCHIVE_WARN || err == ARCHIVE_OK) &&
	    tar->header_recursion_depth == 0 &&
	    tar->process_mac_extensions) {
		int err2 = read_mac_metadata_blob(a, tar, entry, h, unconsumed);
		if (err2 < err)
			err = err2;
	}

	/* We return warnings or success as-is.  Anything else is fatal. */
	if (err == ARCHIVE_WARN || err == ARCHIVE_OK) {
		if (tar->sparse_gnu_pending) {
			if (tar->sparse_gnu_major == 1 &&
			    tar->sparse_gnu_minor == 0) {
				ssize_t bytes_read;

				tar->sparse_gnu_pending = 0;
				/* Read initial sparse map. */
				bytes_read = gnu_sparse_10_read(a, tar, unconsumed);
				if (bytes_read < 0)
					return ((int)bytes_read);
				tar->entry_bytes_remaining -= bytes_read;
			} else {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "Unrecognized GNU sparse file format");
				return (ARCHIVE_WARN);
			}
			tar->sparse_gnu_pending = 0;
		}
		return (err);
	}
	if (err == ARCHIVE_EOF)
		/* EOF when recursively reading a header is bad. */
		archive_set_error(&a->archive, EINVAL, "Damaged tar archive");
	return (ARCHIVE_FATAL);
}